

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  long in_RSI;
  int ret;
  secp256k1_scalar sec;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)in_stack_ffffffffffffffb8);
    local_4 = 0;
  }
  else {
    local_4 = secp256k1_scalar_set_b32_seckey
                        ((secp256k1_scalar *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    secp256k1_scalar_clear((secp256k1_scalar *)0x10ffc47);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}